

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_name_match_unittest.cc
# Opt level: O2

void __thiscall
bssl::VerifyNameMatchNormalizationTest_CollapseWhitespace_Test::
~VerifyNameMatchNormalizationTest_CollapseWhitespace_Test
          (VerifyNameMatchNormalizationTest_CollapseWhitespace_Test *this)

{
  ~VerifyNameMatchNormalizationTest_CollapseWhitespace_Test
            ((VerifyNameMatchNormalizationTest_CollapseWhitespace_Test *)
             &this[-1].super_VerifyNameMatchNormalizationTest.
              super_TestWithParam<std::tuple<bool,_const_char_*>_>.super_Test.gtest_flag_saver_);
  return;
}

Assistant:

TEST_P(VerifyNameMatchNormalizationTest, CollapseWhitespace) {
  std::string normal;
  ASSERT_TRUE(LoadTestData("ascii", value_type(), "unmangled", &normal));
  std::string whitespace;
  ASSERT_TRUE(
      LoadTestData("ascii", value_type(), "extra_whitespace", &whitespace));
  EXPECT_EQ(expected_result(),
            VerifyNameMatch(SequenceValueFromString(normal),
                            SequenceValueFromString(whitespace)));
  EXPECT_EQ(expected_result(),
            VerifyNameMatch(SequenceValueFromString(whitespace),
                            SequenceValueFromString(normal)));
}